

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O3

InterchangeObject * __thiscall
ASDCP::MXF::InterchangeObject::WriteToTLVSet(InterchangeObject *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                            MDD_InterchangeObject_InstanceUID);
  TLVWriter::WriteObject((TLVWriter *)this,in_RDX,(IArchive *)pMVar1);
  if (-1 < *(int *)&(this->super_KLVPacket)._vptr_KLVPacket) {
    pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_GenerationInterchangeObject_GenerationUID);
    TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
    Kumu::Result_t::~Result_t((Result_t *)&local_80);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::InterchangeObject::WriteToTLVSet(TLVWriter& TLVSet)
{
  Result_t result = TLVSet.WriteObject(OBJ_WRITE_ARGS(InterchangeObject, InstanceUID));
  if ( ASDCP_SUCCESS(result) )
    result = TLVSet.WriteObject(OBJ_WRITE_ARGS_OPT(GenerationInterchangeObject, GenerationUID));
  return result;
}